

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::HostFunc>::RefPtr
          (RefPtr<wabt::interp::HostFunc> *this,Store *store,Ref ref)

{
  _Bit_iterator *p_Var1;
  uint uVar2;
  ulong *puVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  Index IVar7;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar8;
  ulong uVar9;
  iterator __position;
  
  bVar6 = Store::Is<wabt::interp::HostFunc>(store,ref);
  if (bVar6) {
    IVar7 = Store::NewRoot(store,ref);
    this->root_index_ = IVar7;
    puVar8 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
             ::Get(&store->objects_,ref.index);
    this->obj_ = (HostFunc *)
                 (puVar8->_M_t).
                 super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
                 .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
    this->store_ = store;
    return;
  }
  interp::RefPtr();
  p_Var1 = &(((vector<bool,_std::allocator<bool>_> *)ref.index)->
            super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish;
  puVar3 = (p_Var1->super__Bit_iterator_base)._M_p;
  uVar2 = (((vector<bool,_std::allocator<bool>_> *)ref.index)->
          super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
          super__Bit_iterator_base._M_offset;
  uVar4 = (p_Var1->super__Bit_iterator_base)._M_p;
  uVar5 = (p_Var1->super__Bit_iterator_base)._M_offset;
  __position.super__Bit_iterator_base._M_offset = uVar5;
  __position.super__Bit_iterator_base._M_p = (_Bit_type *)uVar4;
  if (puVar3 != (((vector<bool,_std::allocator<bool>_> *)ref.index)->
                super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                _M_end_of_storage) {
    (((vector<bool,_std::allocator<bool>_> *)ref.index)->super__Bvector_base<std::allocator<bool>_>)
    ._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = uVar2 + 1;
    if (uVar2 == 0x3f) {
      (((vector<bool,_std::allocator<bool>_> *)ref.index)->
      super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = 0;
      (((vector<bool,_std::allocator<bool>_> *)ref.index)->
      super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_p = puVar3 + 1;
    }
    uVar9 = 1L << ((byte)uVar2 & 0x3f);
    if (SUB81(store,0) != false) {
      *puVar3 = *puVar3 | uVar9;
      return;
    }
    *puVar3 = *puVar3 & ~uVar9;
    return;
  }
  __position.super__Bit_iterator_base._12_4_ = 0;
  std::vector<bool,_std::allocator<bool>_>::_M_insert_aux
            ((vector<bool,_std::allocator<bool>_> *)ref.index,__position,SUB81(store,0));
  return;
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index).get());
  store_ = &store;
}